

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

BYTE * __thiscall FBehavior::FindChunk(FBehavior *this,DWORD id)

{
  DWORD *pDVar1;
  
  pDVar1 = (DWORD *)this->Chunks;
  if (pDVar1 != (DWORD *)0x0) {
    for (; pDVar1 < this->Data + this->DataSize;
        pDVar1 = (DWORD *)((long)pDVar1 + (ulong)(pDVar1[1] + 8))) {
      if (*pDVar1 == id) {
        return (BYTE *)pDVar1;
      }
    }
  }
  return (BYTE *)0x0;
}

Assistant:

BYTE *FBehavior::FindChunk (DWORD id) const
{
	BYTE *chunk = Chunks;

	while (chunk != NULL && chunk < Data + DataSize)
	{
		if (((DWORD *)chunk)[0] == id)
		{
			return chunk;
		}
		chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	}
	return NULL;
}